

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ServerList.cpp
# Opt level: O3

void __thiscall
RenX_ServerListPlugin::addServerToServerList(RenX_ServerListPlugin *this,Server *server)

{
  string *this_00;
  ulong __n1;
  string server_json_block;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  server_as_json_abi_cxx11_(&local_38,this,server);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_58,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  this_00 = &this->m_server_list_json;
  __n1 = (this->m_server_list_json)._M_string_length;
  if (__n1 < 3) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace_aux
              (this_00,0,__n1,1,'[');
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (this_00);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (this_00,',');
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (this_00,local_58._M_dataplus._M_p,local_58._M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (this_00,']');
  updateMetadata(this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void RenX_ServerListPlugin::addServerToServerList(RenX::Server &server) {
	std::string server_json_block;

	// append to server_list_json
	server_json_block = server_as_json(server);
	if (m_server_list_json.size() <= 2) {
		m_server_list_json = '[';
	}
	else {
		m_server_list_json.pop_back(); // remove trailing ']'.
		m_server_list_json += ',';
	}
	m_server_list_json += server_json_block;
	m_server_list_json += ']';

	// Also update metadata so it reflects the now added server
	updateMetadata();
}